

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshortcut_widgets.cpp
# Opt level: O0

bool correctGraphicsWidgetContext(ShortcutContext context,QGraphicsWidget *w,QWidget *active_window)

{
  QGraphicsView *pQVar1;
  bool bVar2;
  WindowType WVar3;
  QGraphicsScene *pQVar4;
  QGraphicsItem *pQVar5;
  const_iterator o;
  QGraphicsView **ppQVar6;
  QWidget *pQVar7;
  QGraphicsWidget *this;
  QGraphicsWidget *pQVar8;
  QWidget *in_RDX;
  QGraphicsWidget *in_RSI;
  int in_EDI;
  long in_FS_OFFSET;
  QGraphicsWidget *a;
  QGraphicsView *view_1;
  QList<QGraphicsView_*> *__range1;
  QGraphicsView *activeView;
  QList<QGraphicsView_*> *views;
  QGraphicsWidget *tw;
  QGraphicsItem *ti;
  QGraphicsView *view;
  QList<QGraphicsView_*> *__range2;
  QList<QGraphicsView_*> *views_1;
  bool visible;
  const_iterator __end1;
  const_iterator __begin1;
  const_iterator __end2;
  const_iterator __begin2;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  QWidget *in_stack_fffffffffffffee8;
  undefined5 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef5;
  undefined1 in_stack_fffffffffffffef6;
  undefined1 in_stack_fffffffffffffef7;
  QGraphicsWidget *local_108;
  QGraphicsItem *local_e8;
  QGraphicsView *local_c8;
  QGraphicsWidget *local_b8;
  bool local_69;
  const_iterator local_58 [4];
  QGraphicsView **local_38;
  const_iterator local_30;
  const_iterator local_28 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDX == (QWidget *)0x0) {
    local_69 = false;
  }
  else {
    bVar2 = QGraphicsItem::isVisible((QGraphicsItem *)0x4bef48);
    if (((bVar2) && (bVar2 = QGraphicsItem::isEnabled((QGraphicsItem *)0x4bef6c), bVar2)) &&
       (pQVar4 = QGraphicsItem::scene((QGraphicsItem *)0x4bef83), pQVar4 != (QGraphicsScene *)0x0))
    {
      if (in_EDI == 2) {
        QGraphicsItem::scene((QGraphicsItem *)0x4befc7);
        QGraphicsScene::views((QGraphicsScene *)in_stack_fffffffffffffee8);
        local_28[0].i = (QGraphicsView **)&DAT_aaaaaaaaaaaaaaaa;
        local_28[0] = QList<QGraphicsView_*>::begin
                                ((QList<QGraphicsView_*> *)
                                 CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
        local_30.i = (QGraphicsView **)&DAT_aaaaaaaaaaaaaaaa;
        local_30 = QList<QGraphicsView_*>::end
                             ((QList<QGraphicsView_*> *)
                              CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
        while( true ) {
          local_38 = local_30.i;
          bVar2 = QList<QGraphicsView_*>::const_iterator::operator!=(local_28,local_30);
          if (!bVar2) break;
          QList<QGraphicsView_*>::const_iterator::operator*(local_28);
          bVar2 = QApplicationPrivate::tryModalHelper
                            (in_stack_fffffffffffffee8,
                             (QWidget **)
                             CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
          if (bVar2) {
            local_69 = true;
            goto LAB_004bf0e4;
          }
          QList<QGraphicsView_*>::const_iterator::operator++(local_28);
        }
        local_69 = false;
LAB_004bf0e4:
        QList<QGraphicsView_*>::~QList((QList<QGraphicsView_*> *)0x4bf0f1);
      }
      else if (in_EDI == 0) {
        local_e8 = (QGraphicsItem *)0x0;
        if (in_RSI != (QGraphicsWidget *)0x0) {
          local_e8 = &(in_RSI->super_QGraphicsObject).super_QGraphicsItem;
        }
        QGraphicsItem::scene((QGraphicsItem *)0x4bf143);
        pQVar5 = QGraphicsScene::focusItem
                           ((QGraphicsScene *)
                            CONCAT17(in_stack_fffffffffffffef7,
                                     CONCAT16(in_stack_fffffffffffffef6,
                                              CONCAT15(in_stack_fffffffffffffef5,
                                                       in_stack_fffffffffffffef0))));
        local_69 = local_e8 == pQVar5;
      }
      else if (in_EDI == 3) {
        QGraphicsItem::scene((QGraphicsItem *)0x4bf186);
        pQVar5 = QGraphicsScene::focusItem
                           ((QGraphicsScene *)
                            CONCAT17(in_stack_fffffffffffffef7,
                                     CONCAT16(in_stack_fffffffffffffef6,
                                              CONCAT15(in_stack_fffffffffffffef5,
                                                       in_stack_fffffffffffffef0))));
        if ((pQVar5 == (QGraphicsItem *)0x0) ||
           (bVar2 = QGraphicsItem::isWidget((QGraphicsItem *)0x4bf1a9), !bVar2)) {
          local_69 = false;
        }
        else {
          if (pQVar5 == (QGraphicsItem *)0x0) {
            local_108 = (QGraphicsWidget *)0x0;
          }
          else {
            local_108 = (QGraphicsWidget *)(pQVar5 + -1);
          }
          local_b8 = local_108;
          while( true ) {
            bVar2 = false;
            if ((local_b8 != (QGraphicsWidget *)0x0) && (bVar2 = false, local_b8 != in_RSI)) {
              WVar3 = QGraphicsWidget::windowType
                                ((QGraphicsWidget *)
                                 CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
              bVar2 = true;
              if (WVar3 != Widget) {
                WVar3 = QGraphicsWidget::windowType
                                  ((QGraphicsWidget *)
                                   CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
                bVar2 = WVar3 == Popup;
              }
            }
            if (!bVar2) break;
            local_b8 = QGraphicsItem::parentWidget(pQVar5);
          }
          local_69 = local_b8 == in_RSI;
        }
      }
      else {
        QGraphicsItem::scene((QGraphicsItem *)0x4bf2a5);
        QGraphicsScene::views((QGraphicsScene *)in_stack_fffffffffffffee8);
        local_c8 = (QGraphicsView *)0x0;
        local_58[0].i = (QGraphicsView **)&DAT_aaaaaaaaaaaaaaaa;
        local_58[0] = QList<QGraphicsView_*>::begin
                                ((QList<QGraphicsView_*> *)
                                 CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
        o = QList<QGraphicsView_*>::end
                      ((QList<QGraphicsView_*> *)
                       CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
        while (bVar2 = QList<QGraphicsView_*>::const_iterator::operator!=(local_58,o),
              pQVar1 = local_c8, bVar2) {
          ppQVar6 = QList<QGraphicsView_*>::const_iterator::operator*(local_58);
          pQVar1 = *ppQVar6;
          pQVar7 = QWidget::window((QWidget *)
                                   CONCAT17(in_stack_fffffffffffffef7,
                                            CONCAT16(in_stack_fffffffffffffef6,
                                                     CONCAT15(in_stack_fffffffffffffef5,
                                                              in_stack_fffffffffffffef0))));
          if (pQVar7 == in_RDX) break;
          QList<QGraphicsView_*>::const_iterator::operator++(local_58);
        }
        local_c8 = pQVar1;
        if (local_c8 == (QGraphicsView *)0x0) {
          local_69 = false;
        }
        else {
          QGraphicsItem::scene((QGraphicsItem *)0x4bf3c8);
          this = QGraphicsScene::activeWindow((QGraphicsScene *)in_stack_fffffffffffffee8);
          pQVar8 = QGraphicsItem::window((QGraphicsItem *)in_stack_fffffffffffffee8);
          local_69 = true;
          if (pQVar8 != (QGraphicsWidget *)0x0) {
            pQVar8 = QGraphicsItem::window((QGraphicsItem *)this);
            local_69 = this == pQVar8;
          }
        }
        QList<QGraphicsView_*>::~QList((QList<QGraphicsView_*> *)0x4bf447);
      }
    }
    else {
      local_69 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_69;
}

Assistant:

static bool correctGraphicsWidgetContext(Qt::ShortcutContext context, QGraphicsWidget *w, QWidget *active_window)
{
    if (!active_window)
        return false;

    bool visible = w->isVisible();
#if defined(Q_OS_DARWIN) && QT_CONFIG(menubar)
    if (!QCoreApplication::testAttribute(Qt::AA_DontUseNativeMenuBar) && qobject_cast<QMenuBar *>(w))
        visible = true;
#endif

    if (!visible || !w->isEnabled() || !w->scene())
        return false;

    if (context == Qt::ApplicationShortcut) {
        // Applicationwide shortcuts are always reachable unless their owner
        // is shadowed by modality. In QGV there's no modality concept, but we
        // must still check if all views are shadowed.
        const auto &views = w->scene()->views();
        for (auto view : views) {
            if (QApplicationPrivate::tryModalHelper(view, nullptr))
                return true;
        }
        return false;
    }

    if (context == Qt::WidgetShortcut)
        return static_cast<QGraphicsItem *>(w) == w->scene()->focusItem();

    if (context == Qt::WidgetWithChildrenShortcut) {
        const QGraphicsItem *ti = w->scene()->focusItem();
        if (ti && ti->isWidget()) {
            const auto *tw = static_cast<const QGraphicsWidget *>(ti);
            while (tw && tw != w && (tw->windowType() == Qt::Widget || tw->windowType() == Qt::Popup))
                tw = tw->parentWidget();
            return tw == w;
        }
        return false;
    }

    // Below is Qt::WindowShortcut context

    // Find the active view (if any).
    const auto &views = w->scene()->views();
    QGraphicsView *activeView = nullptr;
    for (auto view : views) {
        if (view->window() == active_window) {
            activeView = view;
            break;
        }
    }
    if (!activeView)
        return false;

    // The shortcut is reachable if owned by a windowless widget, or if the
    // widget's window is the same as the focus item's window.
    QGraphicsWidget *a = w->scene()->activeWindow();
    return !w->window() || a == w->window();
}